

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O1

bool jpge::compress_image_to_jpeg_file_in_memory
               (void *pDstBuf,int *buf_size,int width,int height,int num_channels,uint8 *pImage_data
               ,params *comp_params)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  memory_stream dst_stream;
  jpeg_encoder dst_image;
  undefined **local_3500;
  void *local_34f8;
  int local_34f0;
  int local_34ec;
  jpeg_encoder local_34e8;
  
  local_34f0 = *buf_size;
  bVar1 = false;
  if (local_34f0 != 0 && pDstBuf != (void *)0x0) {
    local_3500 = &PTR__output_stream_001ce7d0;
    local_34ec = 0;
    *buf_size = 0;
    local_34f8 = pDstBuf;
    jpeg_encoder::jpeg_encoder(&local_34e8);
    iVar2 = jpeg_encoder::init(&local_34e8,(EVP_PKEY_CTX *)&local_3500);
    iVar3 = 0;
    if ((char)iVar2 != '\0') {
      bVar5 = 1;
      do {
        if (0 < height) {
          iVar2 = 0;
          uVar4 = (ulong)(uint)height;
          do {
            bVar1 = jpeg_encoder::process_scanline(&local_34e8,pImage_data + iVar2);
            if (!bVar1) goto LAB_00156ab2;
            iVar2 = iVar2 + num_channels * width;
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        }
        if ((byte)(local_34e8.m_pass_num - 3) < 0xfe) {
LAB_00156ab2:
          if (bVar5 != 0) {
            iVar3 = 0;
            goto LAB_00156ae8;
          }
          break;
        }
        if (local_34e8.m_all_stream_writes_succeeded == true) {
          jpeg_encoder::process_end_of_image(&local_34e8);
        }
        if (local_34e8.m_all_stream_writes_succeeded == false) goto LAB_00156ab2;
        bVar1 = iVar3 == 0;
        iVar3 = iVar3 + 1;
        bVar5 = bVar1 & local_34e8.m_params.m_two_pass_flag;
      } while (bVar5 == 1);
      free(local_34e8.m_mcu_lines[0]);
      local_34e8.m_mcu_lines[0] = (uint8 *)0x0;
      local_34e8.m_pass_num = '\0';
      local_34e8.m_all_stream_writes_succeeded = true;
      *buf_size = local_34ec;
      iVar3 = 1;
    }
LAB_00156ae8:
    bVar1 = SUB41(iVar3,0);
    jpeg_encoder::~jpeg_encoder(&local_34e8);
  }
  return bVar1;
}

Assistant:

bool compress_image_to_jpeg_file_in_memory(void* pDstBuf, int& buf_size, int width, int height, int num_channels, const uint8* pImage_data, const params& comp_params)
	{
		if ((!pDstBuf) || (!buf_size))
			return false;

		memory_stream dst_stream(pDstBuf, buf_size);

		buf_size = 0;

		jpge::jpeg_encoder dst_image;
		if (!dst_image.init(&dst_stream, width, height, num_channels, comp_params))
			return false;

		for (uint pass_index = 0; pass_index < dst_image.get_total_passes(); pass_index++)
		{
			for (int i = 0; i < height; i++)
			{
				const uint8* pScanline = pImage_data + i * width * num_channels;
				if (!dst_image.process_scanline(pScanline))
					return false;
			}
			if (!dst_image.process_scanline(NULL))
				return false;
		}

		dst_image.deinit();

		buf_size = dst_stream.get_size();
		return true;
	}